

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdin.c
# Opt level: O3

char * bc_stdin_read(size_t *len)

{
  int iVar1;
  bc_string_t *str;
  char *pcVar2;
  
  if (len != (size_t *)0x0) {
    str = bc_string_new();
    while( true ) {
      iVar1 = fgetc(_stdin);
      if (iVar1 == -1) break;
      bc_string_append_c(str,(char)iVar1);
    }
    *len = str->len;
    pcVar2 = bc_string_free(str,false);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char*
bc_stdin_read(size_t *len)
{
    if (len == NULL)
        return NULL;

    int c;
    bc_string_t *rv = bc_string_new();
    while (EOF != (c = fgetc(stdin)))
        bc_string_append_c(rv, c);
    *len = rv->len;
    return bc_string_free(rv, false);
}